

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

size_t aead_encrypt(st_ptls_traffic_protection_t *ctx,void *output,void *input,size_t inlen,
                   uint8_t content_type)

{
  uint64_t seq;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t off;
  uint8_t aad [5];
  size_t sStack_28;
  uint8_t content_type_local;
  size_t inlen_local;
  void *input_local;
  void *output_local;
  st_ptls_traffic_protection_t *ctx_local;
  
  off._7_1_ = content_type;
  sStack_28 = inlen;
  build_aad((uint8_t *)((long)&off + 2),inlen + 1 + ctx->aead->algo->tag_size);
  seq = ctx->seq;
  ctx->seq = seq + 1;
  ptls_aead_encrypt_init(ctx->aead,seq,(void *)((long)&off + 2),5);
  sVar1 = ptls_aead_encrypt_update(ctx->aead,output,input,sStack_28);
  sVar2 = ptls_aead_encrypt_update
                    (ctx->aead,(void *)((long)output + sVar1),(void *)((long)&off + 7),1);
  sVar3 = ptls_aead_encrypt_final(ctx->aead,(void *)((long)output + sVar2 + sVar1));
  return sVar3 + sVar2 + sVar1;
}

Assistant:

static size_t aead_encrypt(struct st_ptls_traffic_protection_t *ctx, void *output, const void *input, size_t inlen,
                           uint8_t content_type)
{
    uint8_t aad[5];
    size_t off = 0;

    build_aad(aad, inlen + 1 + ctx->aead->algo->tag_size);
    ptls_aead_encrypt_init(ctx->aead, ctx->seq++, aad, sizeof(aad));
    off += ptls_aead_encrypt_update(ctx->aead, ((uint8_t *)output) + off, input, inlen);
    off += ptls_aead_encrypt_update(ctx->aead, ((uint8_t *)output) + off, &content_type, 1);
    off += ptls_aead_encrypt_final(ctx->aead, ((uint8_t *)output) + off);

    return off;
}